

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O2

void __thiscall Program::Program(Program *this)

{
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016da90;
  (this->m_constant_declaration).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d358;
  (this->m_constant_declaration).m_constant_definition.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d300;
  (this->m_constant_declaration).m_constant_definition.m_identifier_name._M_dataplus._M_p =
       (pointer)&(this->m_constant_declaration).m_constant_definition.m_identifier_name.field_2;
  (this->m_constant_declaration).m_constant_definition.m_identifier_name._M_string_length = 0;
  (this->m_constant_declaration).m_constant_definition.m_identifier_name.field_2._M_local_buf[0] =
       '\0';
  (this->m_variable_declaration).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d408;
  (this->m_variable_declaration).m_variable_definition.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d3b0;
  (this->m_variable_declaration).m_variable_definition.m_identifier_name._M_dataplus._M_p =
       (pointer)&(this->m_variable_declaration).m_variable_definition.m_identifier_name.field_2;
  (this->m_variable_declaration).m_variable_definition.m_identifier_name._M_string_length = 0;
  (this->m_variable_declaration).m_variable_definition.m_identifier_name.field_2._M_local_buf[0] =
       '\0';
  FunctionDefinition::FunctionDefinition(&this->m_function_definition);
  MainFunction::MainFunction(&this->m_main_function);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a c0 program");
        g_log_tools->GrammaNormalLogs(str);
    }